

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

RequestBuilder * __thiscall
restincurl::RequestBuilder::SendData<std::__cxx11::string>
          (RequestBuilder *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  _Head_base<0UL,_restincurl::Request_*,_false> _Var1;
  __uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
  _Var2;
  _Alloc_hider dh;
  RequestBuilder *pRVar3;
  pointer __p;
  _Alloc_hider local_20;
  
  if (this->is_built_ != true) {
    std::make_unique<restincurl::OutDataHandler<std::__cxx11::string>,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
    dh._M_p = local_20._M_p;
    _Var1._M_head_impl =
         (this->request_)._M_t.
         super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
         super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
         super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
    local_20._M_p = (pointer)0x0;
    _Var2._M_t.
    super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
    .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl =
         *(tuple<restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_> *
          )&((_Var1._M_head_impl)->default_out_handler_)._M_t;
    ((_Var1._M_head_impl)->default_out_handler_)._M_t =
         (__uniq_ptr_data<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>,_true,_true>
          )dh._M_p;
    if ((__uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
         )_Var2._M_t.
          super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
          .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
         )0x0) {
      (**(code **)(*(long *)_Var2._M_t.
                            super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
                            .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>.
                            _M_head_impl + 8))();
    }
    pRVar3 = SendData<std::__cxx11::string>
                       (this,(OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)dh._M_p);
    if ((long *)local_20._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_20._M_p + 8))();
    }
    return pRVar3;
  }
  __assert_fail("!is_built_",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x5a0,
                "RequestBuilder &restincurl::RequestBuilder::SendData(T) [T = std::basic_string<char>]"
               );
}

Assistant:

RequestBuilder& SendData(T data) {
            assert(!is_built_);
            auto handler = std::make_unique<OutDataHandler<T>>(std::move(data));
            auto& handler_ref = *handler;
            request_->SetDefaultOutHandler(std::move(handler));
            return SendData(handler_ref);
        }